

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O2

void __thiscall
gmath::IDWNode::get(IDWNode *this,uint _x,uint _y,float *nominator,float *denominator)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = (float)_x - this->xs;
  fVar3 = (float)_y - this->ys;
  fVar2 = fVar2 * fVar2 + fVar3 * fVar3;
  if ((this->n == 1) || (this->r2 <= fVar2)) {
    if (fVar2 <= 0.0) {
      fVar2 = 1e+06;
      *nominator = this->f * 1e+06;
    }
    else {
      fVar2 = ((float)this->n * this->w) / fVar2;
      *nominator = this->f * fVar2 + *nominator;
      fVar2 = fVar2 + *denominator;
    }
    *denominator = fVar2;
  }
  else {
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      if (this->child[lVar1] != (IDWNode *)0x0) {
        get(this->child[lVar1],_x,_y,nominator,denominator);
      }
    }
  }
  return;
}

Assistant:

void IDWNode::get(unsigned int _x, unsigned int _y, float &nominator, float &denominator) const
{
  const float xd=_x-xs;
  const float yd=_y-ys;
  float l2=xd*xd+yd*yd;

  // if individual value or is this node far away?

  if (n == 1 || l2 >= r2)
  {
    if (l2 > 0)
    {
      // interpolate from this node

      float v=w*n/l2;
      nominator+=v*f;
      denominator+=v;
    }
    else
    {
      // if requested coordinate matches coordinate of data value, then just
      // take the data value

      nominator=1e6f*f;
      denominator=1e6;
    }
  }
  else
  {
    // interpolate from all children individually

    for (int i=0; i<4; i++)
    {
      if (child[i] != 0)
      {
        child[i]->get(_x, _y, nominator, denominator);
      }
    }
  }
}